

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bruteforce.hpp
# Opt level: O0

PointSet * __thiscall hnsw::BruteForceIndex::Search(BruteForceIndex *this,uint32_t K,float *query)

{
  bool bVar1;
  float *pfVar2;
  size_type sVar3;
  Matrix *in_RCX;
  uint in_EDX;
  priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointLessComparator>
  *in_RSI;
  priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointLessComparator>
  *in_RDI;
  float dist;
  uint32_t i;
  MaxPointHeap result;
  PointSet *neighbors;
  pointer row;
  priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointLessComparator>
  *in_stack_ffffffffffffff80;
  Matrix *pMVar4;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointLessComparator>
  *__args;
  uint local_44;
  
  __args = in_RDI;
  std::
  priority_queue<std::pair<unsigned_int,float>,std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,hnsw::PointLessComparator>
  ::
  priority_queue<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,void>
            (in_stack_ffffffffffffff80);
  for (local_44 = 0; local_44 < *(uint *)&in_RSI[1].field_0x18; local_44 = local_44 + 1) {
    row = in_RSI[2].c.
          super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    pMVar4 = in_RCX;
    pfVar2 = Matrix::operator[](in_RCX,(size_t)row);
    in_stack_ffffffffffffff8c = (**(code **)*row)(row,pMVar4,pfVar2);
    std::
    priority_queue<std::pair<unsigned_int,float>,std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,hnsw::PointLessComparator>
    ::emplace<unsigned_int&,float&>(in_RSI,(uint *)__args,(float *)in_RDI);
    sVar3 = std::
            priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointLessComparator>
            ::size((priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointLessComparator>
                    *)0x113856);
    if (in_EDX < sVar3) {
      std::
      priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointLessComparator>
      ::pop(in_RDI);
    }
  }
  std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
  vector((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *
         )0x1138a1);
  while (bVar1 = std::
                 priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointLessComparator>
                 ::empty((priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointLessComparator>
                          *)0x1138ab), ((bVar1 ^ 0xffU) & 1) != 0) {
    std::
    priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointLessComparator>
    ::top((priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointLessComparator>
           *)0x1138bd);
    std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
    push_back(&in_RDI->c,(value_type *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
             );
    std::
    priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointLessComparator>
    ::pop(in_RDI);
  }
  std::
  priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointLessComparator>
  ::~priority_queue((priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointLessComparator>
                     *)0x113914);
  return &__args->c;
}

Assistant:

PointSet Search(uint32_t K, const float *query) {
    MaxPointHeap result;
    for (uint32_t i = 0; i < num_points_; i++) {
      float dist = distance_(query, points_[i]);
      result.emplace(i, dist);
      if (result.size() > K) {
        result.pop();
      }
    }

    PointSet neighbors;
    while (!result.empty()) {
      neighbors.push_back(result.top());
      result.pop();
    }
    return neighbors;
  }